

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

void __thiscall
DnsStats::SubmitQueryExtensions
          (DnsStats *this,uint8_t *packet,uint32_t length,uint32_t name_offset,uint8_t *client_addr,
          size_t client_addr_length)

{
  BinHash<TldAsKey> *this_00;
  uint8_t *domain;
  byte bVar1;
  uint8_t uVar2;
  DnsStats *this_01;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  TldAsKey *pTVar6;
  ulong length_00;
  uint8_t uVar7;
  ulong uVar8;
  bool is_bad_syntax;
  bool is_numeric;
  bool is_binary;
  uint32_t tld_offset;
  uint32_t previous_offset;
  int nb_name_parts;
  TldAsKey key;
  bool local_cf;
  bool local_ce;
  bool local_cd;
  uint32_t local_cc;
  uint8_t *local_c8;
  size_t local_c0;
  DnsStats *local_b8;
  uint32_t local_b0 [2];
  TldAsKey local_a8;
  
  local_cc = 0;
  local_b0[1] = 0;
  local_b0[0] = 0;
  bVar3 = GetTLD(packet,length,name_offset,&local_cc,local_b0,(int *)(local_b0 + 1));
  if (bVar3) {
    local_cd = false;
    local_cf = false;
    local_ce = false;
    uVar8 = (ulong)local_cc;
    domain = packet + uVar8 + 1;
    length_00 = (ulong)domain[-1];
    local_c8 = client_addr;
    local_c0 = client_addr_length;
    local_b8 = this;
    TldCheck(domain,length_00,&local_cd,&local_cf,&local_ce);
    this_01 = local_b8;
    if ((local_cd == false) && (local_cf == false)) {
      if (length_00 != 0) {
        uVar5 = 0;
        do {
          if ((byte)(domain[uVar5] + 0x9f) < 0x1a) {
            domain[uVar5] = domain[uVar5] + 0xe0;
          }
          uVar5 = uVar5 + 1;
        } while (length_00 != uVar5);
      }
      bVar1 = packet[uVar8];
      local_a8.HashNext = (TldAsKey *)0x0;
      local_a8.MoreRecentKey = (TldAsKey *)0x0;
      local_a8.LessRecentKey = (TldAsKey *)0x0;
      local_a8.max_name_parts = 1;
      local_a8.count = 1;
      local_a8.hash = 0;
      bVar4 = 0x40;
      if (bVar1 < 0x40) {
        bVar4 = bVar1;
      }
      if (bVar1 == 0) {
        local_a8.tld_len = 0;
      }
      else {
        local_a8.tld_len = 0;
        do {
          uVar2 = domain[local_a8.tld_len];
          uVar7 = uVar2 + 0xe0;
          if (0x19 < (byte)(uVar2 + 0x9f)) {
            uVar7 = uVar2;
          }
          local_a8.tld[local_a8.tld_len] = uVar7;
          local_a8.tld_len = local_a8.tld_len + 1;
        } while (bVar4 != local_a8.tld_len);
      }
      local_a8.tld[local_a8.tld_len] = '\0';
      this_00 = &local_b8->registeredTld;
      if ((local_b8->registeredTld).tableCount == 0) {
        LoadRegisteredTLD_from_memory(local_b8);
      }
      pTVar6 = BinHash<TldAsKey>::Retrieve(this_00,&local_a8);
      if (pTVar6 != (TldAsKey *)0x0) {
        RegisterOptionsByIp(this_01,local_c8,local_c0);
      }
    }
  }
  return;
}

Assistant:

void DnsStats::SubmitQueryExtensions(
    uint8_t* packet, uint32_t length, uint32_t name_offset,
    uint8_t* client_addr, size_t client_addr_length)
{
    uint32_t tld_offset = 0;
    int nb_name_parts = 0;
    uint32_t previous_offset = 0;
    bool gotTld = GetTLD(packet, length, name_offset, &tld_offset, &previous_offset, &nb_name_parts);

    if (gotTld)
    {
        bool is_binary = false;
        bool is_bad_syntax = false;
        bool is_numeric = false;

        /* Verify that the TLD is valid, so as to exclude random traffic that would drown the stats */
        TldCheck(packet + tld_offset + 1, packet[tld_offset], &is_binary, &is_bad_syntax, &is_numeric);

        if (!is_binary && !is_bad_syntax) {
            SetToUpperCase(packet + tld_offset + 1, packet[tld_offset]);
            TldAsKey key(packet + tld_offset + 1, packet[tld_offset]);

            if (registeredTld.GetCount() == 0)
            {
                LoadRegisteredTLD_from_memory();
            }

            if (registeredTld.Retrieve(&key) != NULL)
            {
                /* This is a registered TLD
                 * Use the list of source addresses as a filter to
                 * check the incoming EDNS options */
                RegisterOptionsByIp(client_addr, client_addr_length);
            }
        }
    }
}